

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O2

void perf_get_descriptor(_func_void_integral_image_ptr_interest_point_ptr_float_ptr *function,
                        integral_image *iimage,interest_point *ipoint,float *GW,benchmark_data *data
                        )

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_ZMM2 [64];
  long local_88;
  double local_80;
  double local_78;
  double local_70;
  vector<double,_std::allocator<double>_> cycleslist;
  
  dVar8 = 1.0;
  local_88 = 100;
  do {
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    local_88 = (long)(dVar8 * (double)local_88);
    lVar4 = local_88;
    while (bVar6 = lVar4 != 0, lVar4 = lVar4 + -1, bVar6) {
      (*function)(iimage,ipoint,GW);
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    auVar7 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) - (uVar1 & 0xffffffff)
                                ) + (uVar2 & 0xffffffff) + (uVar2 & 0xffffffff00000000));
    local_78 = auVar7._0_8_;
    dVar8 = 100000000.0 / local_78;
  } while (2.0 < dVar8);
  cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_80 = 0.0;
  for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    local_70 = (double)(uVar1 & 0xffffffff);
    lVar5 = local_88;
    while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
      (*function)(iimage,ipoint,GW);
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    auVar7 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) - (long)local_70) +
                                (uVar2 & 0xffffffff) + (uVar2 & 0xffffffff00000000));
    local_78 = auVar7._0_8_ / (double)local_88;
    local_70 = local_78;
    std::vector<double,_std::allocator<double>_>::push_back(&cycleslist,&local_78);
    local_80 = local_80 + local_70;
  }
  lVar4 = *(long *)(data + 0x210);
  local_78 = local_80 / 10.0;
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  auVar12._8_8_ = 0x3fdfffffffffffff;
  auVar12._0_8_ = 0x3fdfffffffffffff;
  auVar9._0_8_ = ((double)lVar4 * 100.0) / (local_80 / 10.0);
  auVar9._8_8_ = 0;
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar7 = vpternlogq_avx512vl(auVar12,auVar9,auVar3,0xf8);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = auVar9._0_8_ + auVar7._0_8_;
  auVar3 = vroundsd_avx(auVar10,auVar10,0xb);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_78;
  auVar7 = vmovhps_avx(auVar11,*cycleslist.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
  auVar7 = vcvttpd2uqq_avx512vl(auVar7);
  auVar7 = vpaddq_avx(auVar7,*(undefined1 (*) [16])(data + 0x218));
  *(undefined1 (*) [16])(data + 0x218) = auVar7;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1];
  lVar4 = vcvttsd2usi_avx512f(auVar7);
  *(long *)(data + 0x228) = *(long *)(data + 0x228) + lVar4;
  *(double *)(data + 0x230) = auVar3._0_8_ / 100.0 + *(double *)(data + 0x230);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&cycleslist.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void perf_get_descriptor(void (*function)(struct integral_image *, struct interest_point *, float *),
                         struct integral_image *iimage, struct interest_point *ipoint, float *GW,
                         struct benchmark_data &data) {
    double cycles = 0.;
    long num_runs = 100;
    double multiplier = 1;
    uint64_t start, end;

#ifdef WARM_UP
    // Warm-up phase: we determine a number of executions that allows
    // the code to be executed for at least CYCLES_REQUIRED cycles.
    // This helps excluding timing overhead when measuring small runtimes.
    do {
        num_runs = num_runs * multiplier;
        start = start_tsc();
        for (size_t i = 0; i < num_runs; i++) {
            (*function)(iimage, ipoint, GW);
        }
        end = stop_tsc(start);

        cycles = (double)end;
        multiplier = (CYCLES_REQUIRED) / (cycles);

    } while (multiplier > 2);
#endif

    std::vector<double> cycleslist;

    // Actual performance measurements repeated REP times.
    // We simply store all results and compute medians during post-processing.
    double total_cycles = 0;
    for (size_t j = 0; j < REP; j++) {
        start = start_tsc();
        for (size_t i = 0; i < num_runs; ++i) {
            (*function)(iimage, ipoint, GW);
        }
        end = stop_tsc(start);

        cycles = ((double)end) / num_runs;
        total_cycles += cycles;

        cycleslist.push_back(cycles);
    }
    total_cycles /= REP;

    cycles = total_cycles;  // cyclesList.front();
    double flops_per_cycle = round((100.0 * data.num_flops) / cycles) / 100.0;
    std::sort(cycleslist.begin(), cycleslist.end());
    data.avg_cycles += (uint64_t)cycles;
    data.min_cycles += (uint64_t)cycleslist.front();
    data.max_cycles += (uint64_t)cycleslist.back();
    data.flops_per_cycle += flops_per_cycle;
}